

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O0

string * onmt::unicode::cp_to_utf8_abi_cxx11_(code_point_t uc)

{
  byte bVar1;
  ulong uVar2;
  uint in_ESI;
  string *in_RDI;
  uint32_t __uc;
  UBool error;
  int32_t offset;
  uint8_t s [4];
  allocator local_1d [8];
  char local_15;
  int local_14;
  byte local_10;
  byte bStack_f;
  byte bStack_e;
  byte bStack_d;
  
  local_14 = 0;
  local_15 = '\0';
  bVar1 = (byte)in_ESI;
  if (in_ESI < 0x80) {
    local_14 = 1;
    local_10 = bVar1;
  }
  else if (in_ESI < 0x800) {
    local_10 = (byte)(in_ESI >> 6) | 0xc0;
    bStack_f = bVar1 & 0x3f | 0x80;
    local_14 = 2;
  }
  else if ((in_ESI < 0xd800) || ((0xdfff < in_ESI && (in_ESI < 0x10000)))) {
    local_10 = (byte)(in_ESI >> 0xc) | 0xe0;
    bStack_f = (byte)(in_ESI >> 6) & 0x3f | 0x80;
    bStack_e = bVar1 & 0x3f | 0x80;
    local_14 = 3;
  }
  else if ((in_ESI < 0x10000) || (0x10ffff < in_ESI)) {
    local_15 = '\x01';
  }
  else {
    local_10 = (byte)(in_ESI >> 0x12) | 0xf0;
    bStack_f = (byte)(in_ESI >> 0xc) & 0x3f | 0x80;
    bStack_e = (byte)(in_ESI >> 6) & 0x3f | 0x80;
    bStack_d = bVar1 & 0x3f | 0x80;
    local_14 = 4;
  }
  if (local_15 == '\0') {
    uVar2 = (ulong)local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,(char *)&local_10,uVar2,local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string cp_to_utf8(code_point_t uc)
    {
      uint8_t s[U8_MAX_LENGTH];
      int32_t offset = 0;
      UBool error = false;
      U8_APPEND(s, offset, U8_MAX_LENGTH, uc, error);
      if (error)
        return std::string();
      return std::string(reinterpret_cast<std::string::value_type*>(s), offset);
    }